

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O2

int Io_BlifGetLine(Io_BlifMan_t *p,char *pToken)

{
  char *pcVar1;
  int iVar2;
  int i;
  
  i = 0;
  while ((iVar2 = -1, i < p->vLines->nSize &&
         (pcVar1 = (char *)Vec_PtrEntry(p->vLines,i), iVar2 = i, pcVar1 <= pToken))) {
    i = i + 1;
  }
  return iVar2;
}

Assistant:

static int Io_BlifGetLine( Io_BlifMan_t * p, char * pToken )
{
    char * pLine;
    int i;
    Vec_PtrForEachEntry( char *, p->vLines, pLine, i )
        if ( pToken < pLine )
            return i;
    return -1;
}